

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void common_kv_cache_dump_view_seqs(llama_kv_cache_view *view,int row_size)

{
  __node_base _Var1;
  size_type sVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  int iVar6;
  mapped_type mVar7;
  uint uVar8;
  llama_seq_id *plVar9;
  llama_seq_id *plVar10;
  long lVar11;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  seqs;
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  iVar6 = 0;
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n"
         ,(ulong)(uint)view->n_cells,(ulong)(uint)view->n_seq_max,(ulong)(uint)view->used_cells,
         (ulong)(uint)view->token_count,(ulong)(uint)view->max_contiguous,view->max_contiguous_idx);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < view->n_cells) {
    plVar9 = view->cells_sequences;
    uVar5 = (ulong)(uint)view->n_seq_max;
    mVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        lVar11 = 0;
        plVar10 = plVar9;
        do {
          if ((-1 < *plVar10) &&
             (iVar3 = std::
                      _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&local_68,plVar10), sVar2 = local_68._M_element_count,
             iVar3.super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>._M_cur ==
             (__node_type *)0x0)) {
            mVar7 = local_68._M_element_count;
            if (local_68._M_element_count - 0x3e < 0xffffffffffffffc1) break;
            pmVar4 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,plVar10);
            *pmVar4 = sVar2;
          }
          lVar11 = lVar11 + 1;
          plVar10 = plVar10 + 1;
          mVar7 = local_68._M_element_count;
        } while (lVar11 < view->n_seq_max);
      }
      if (mVar7 - 0x3e < 0xffffffffffffffc1) break;
      iVar6 = iVar6 + 1;
      uVar5 = (ulong)view->n_seq_max;
      plVar9 = plVar9 + uVar5;
    } while (iVar6 < view->n_cells);
  }
  printf("=== Sequence legend: ");
  for (_Var1._M_nxt = local_68._M_before_begin._M_nxt; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    printf("%zu=%d, ",_Var1._M_nxt[2]._M_nxt,(ulong)*(uint *)&_Var1._M_nxt[1]._M_nxt);
  }
  printf("\'+\'=other sequence ids");
  if (0 < view->n_cells) {
    plVar9 = view->cells_sequences;
    uVar8 = 0;
    do {
      if ((int)uVar8 % row_size == 0) {
        printf("\n%5d: ",(ulong)uVar8);
      }
      if (0 < view->n_seq_max) {
        lVar11 = 0;
        plVar10 = plVar9;
        do {
          if (*plVar10 < 0) {
            iVar6 = 0x2e;
          }
          else {
            iVar3 = std::
                    _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&local_68,plVar10);
            if (iVar3.super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>._M_cur
                == (__node_type *)0x0) {
              iVar6 = 0x2b;
            }
            else {
              iVar6 = (int)"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                           [*(long *)((long)iVar3.
                                            super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>
                                            ._M_cur + 0x10)];
            }
          }
          putchar(iVar6);
          lVar11 = lVar11 + 1;
          plVar10 = plVar10 + 1;
        } while (lVar11 < view->n_seq_max);
      }
      putchar(0x20);
      uVar8 = uVar8 + 1;
      plVar9 = plVar9 + view->n_seq_max;
    } while ((int)uVar8 < view->n_cells);
  }
  puts("\n=== Done dumping");
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void common_kv_cache_dump_view_seqs(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    std::unordered_map<llama_seq_id, size_t> seqs;
    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] < 0) { continue; }
            if (seqs.find(cs_curr[j]) == seqs.end()) {
                if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
                const size_t sz = seqs.size();
                seqs[cs_curr[j]] = sz;
            }
        }
        if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
    }

    printf("=== Sequence legend: ");
    for (const auto & it : seqs) {
        printf("%zu=%d, ", it.second, it.first);
    }
    printf("'+'=other sequence ids");

    c_curr = view.cells;
    cs_curr = view.cells_sequences;
    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) {
                const auto & it = seqs.find(cs_curr[j]);
                putchar(it != seqs.end() ? int(slot_chars[it->second]) : '+');
            } else {
                putchar('.');
            }
        }
        putchar(' ');
    }

    printf("\n=== Done dumping\n");
}